

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O1

wstring * fs_win32_to_wide_abi_cxx11_(wstring *__return_storage_ptr__,string_view n)

{
  string_view fname;
  error_code local_38;
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  local_38._M_cat = (error_category *)std::_V2::generic_category();
  local_38._M_value = 0x26;
  fname._M_str = "fs_win32_to_wide";
  fname._M_len = 0x10;
  fs_print_error(n,fname,&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

std::wstring fs_win32_to_wide(std::string_view n)
{
  std::error_code ec;

#if defined(_WIN32)
  // https://docs.microsoft.com/en-us/windows/win32/api/stringapiset/nf-stringapiset-multibytetowidechar

  if (int L = MultiByteToWideChar(CP_UTF8, 0, n.data(), -1, nullptr, 0); L > 0)  FFS_LIKELY
  {
    std::wstring buf(L, L'\0');
    if(MultiByteToWideChar(CP_UTF8, 0, n.data(), -1, buf.data(), L) > 0)  FFS_LIKELY
    {
      buf.resize(L-1);  // discard null terminator
      return buf;
    }
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(n, __func__, ec);
  return {};
}